

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

void __thiscall trento::Deuteron::Deuteron(Deuteron *this,double a,double b)

{
  double dVar1;
  
  Nucleus::Nucleus(&this->super_Nucleus,2);
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_0012fa28;
  dVar1 = fmin(a,b);
  this->a_ = dVar1;
  dVar1 = fmax(a,b);
  this->b_ = dVar1;
  return;
}

Assistant:

Deuteron::Deuteron(double a, double b)
    : Nucleus(2),
      a_(std::fmin(a, b)),
      b_(std::fmax(a, b))
{}